

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

LOs __thiscall Omega_h::collect_marked(Omega_h *this,Read<signed_char> *marks)

{
  int size_in;
  char *file;
  void *extraout_RDX;
  LOs LVar1;
  Write<int> local_1a0;
  undefined1 local_190 [8];
  type f;
  string local_158 [32];
  undefined1 local_138 [8];
  Write<int> marked;
  int nmarked;
  Read<signed_char> local_100;
  undefined1 local_f0 [8];
  LOs offsets;
  __cxx11 local_d8 [4];
  LO ntotal;
  allocator local_a1;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [39];
  ScopedTimer local_39;
  Read<signed_char> *pRStack_38;
  ScopedTimer omega_h_scoped_function_timer;
  Read<signed_char> *marks_local;
  LO local_10;
  
  pRStack_38 = marks;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_a1);
  std::operator+(local_80,(char *)local_a0);
  std::__cxx11::to_string(local_d8,0xaf);
  std::operator+(local_60,local_80);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_39,"collect_marked",file);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  if (((ulong)(marks->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (LO)((marks->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (LO)((ulong)(marks->write_).shared_alloc_.alloc >> 3);
  }
  offsets.write_.shared_alloc_.direct_ptr._4_4_ = local_10;
  Read<signed_char>::Read(&local_100,marks);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&nmarked,"",(allocator *)((long)&marked.shared_alloc_.direct_ptr + 7));
  offset_scan<signed_char>((Omega_h *)local_f0,&local_100,(string *)&nmarked);
  std::__cxx11::string::~string((string *)&nmarked);
  std::allocator<char>::~allocator((allocator<char> *)((long)&marked.shared_alloc_.direct_ptr + 7));
  Read<signed_char>::~Read(&local_100);
  size_in = Read<int>::last((Read<int> *)local_f0);
  marked.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,"",(allocator *)((long)&f.offsets.write_.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_138,size_in,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.offsets.write_.shared_alloc_.direct_ptr + 7));
  Read<signed_char>::Read((Read<signed_char> *)local_190,marks);
  Write<int>::Write((Write<int> *)&f.marks.write_.shared_alloc_.direct_ptr,(Write<int> *)local_138);
  Read<int>::Read((Read<int> *)&f.marked.shared_alloc_.direct_ptr,(Read<int> *)local_f0);
  parallel_for<Omega_h::collect_marked(Omega_h::Read<signed_char>)::__0>
            (offsets.write_.shared_alloc_.direct_ptr._4_4_,(type *)local_190);
  Write<int>::Write(&local_1a0,(Write<int> *)local_138);
  Read<int>::Read((Read<int> *)this,&local_1a0);
  Write<int>::~Write(&local_1a0);
  collect_marked(Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_190);
  Write<int>::~Write((Write<int> *)local_138);
  Read<int>::~Read((Read<int> *)local_f0);
  ScopedTimer::~ScopedTimer(&local_39);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs collect_marked(Read<I8> marks) {
  OMEGA_H_TIME_FUNCTION;
  auto ntotal = marks.size();
  auto offsets = offset_scan(marks);
  auto nmarked = offsets.last();
  Write<LO> marked(nmarked);
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (marks[i]) marked[offsets[i]] = i;
  };
  parallel_for(ntotal, std::move(f));
  return marked;
}